

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter.cpp
# Opt level: O2

void __thiscall
Assimp::X3DImporter::GeometryHelper_MakeQL_RectParallelepiped
          (X3DImporter *this,aiVector3D *pSize,
          list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *pVertices)

{
  undefined4 uVar1;
  undefined4 uVar2;
  value_type local_98;
  value_type local_8c;
  value_type local_80;
  value_type local_74;
  value_type local_68;
  value_type vStack_5c;
  value_type local_50;
  value_type vStack_44;
  
  local_98.x = pSize->x * 0.5;
  local_68.x = -local_98.x;
  uVar1 = pSize->y;
  uVar2 = pSize->z;
  local_8c.y = (float)uVar1 * 0.5;
  local_8c.z = (float)uVar2 * 0.5;
  local_98.y = -local_8c.y;
  local_80.z = -local_8c.z;
  local_74._4_8_ = CONCAT44(local_8c.z,local_8c.y);
  local_74._4_8_ = local_74._4_8_ ^ 0x8000000080000000;
  vStack_44._4_8_ = CONCAT44(local_8c.z,local_8c.y);
  vStack_44._4_8_ = vStack_44._4_8_ ^ 0x8000000080000000;
  local_98.z = local_8c.z;
  local_8c.x = local_98.x;
  local_80.x = local_98.x;
  local_80.y = local_8c.y;
  local_74.x = local_98.x;
  local_68.y = local_98.y;
  local_68.z = local_8c.z;
  vStack_5c.x = local_68.x;
  vStack_5c._4_8_ = local_8c._4_8_;
  local_50.x = local_68.x;
  local_50.y = local_8c.y;
  local_50.z = local_80.z;
  vStack_44.x = local_68.x;
  std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (pVertices,&local_74);
  std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (pVertices,&local_80);
  std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (pVertices,&local_8c);
  std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (pVertices,&local_98);
  std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (pVertices,&local_50);
  std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (pVertices,&vStack_44);
  std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (pVertices,&local_68);
  std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (pVertices,&vStack_5c);
  std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (pVertices,&vStack_44);
  std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (pVertices,&local_74);
  std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (pVertices,&local_98);
  std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (pVertices,&local_68);
  std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (pVertices,&local_80);
  std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (pVertices,&local_50);
  std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (pVertices,&vStack_5c);
  std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (pVertices,&local_8c);
  std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (pVertices,&local_98);
  std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (pVertices,&local_8c);
  std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (pVertices,&vStack_5c);
  std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (pVertices,&local_68);
  std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (pVertices,&vStack_44);
  std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (pVertices,&local_50);
  std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (pVertices,&local_80);
  std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (pVertices,&local_74);
  return;
}

Assistant:

void X3DImporter::GeometryHelper_MakeQL_RectParallelepiped(const aiVector3D& pSize, std::list<aiVector3D>& pVertices)
{
	MESH_RectParallelepiped_CREATE_VERT;
	MACRO_FACE_ADD_QUAD_FA(true, pVertices, vert_set, 3, 2, 1, 0);// front
	MACRO_FACE_ADD_QUAD_FA(true, pVertices, vert_set, 6, 7, 4, 5);// back
	MACRO_FACE_ADD_QUAD_FA(true, pVertices, vert_set, 7, 3, 0, 4);// left
	MACRO_FACE_ADD_QUAD_FA(true, pVertices, vert_set, 2, 6, 5, 1);// right
	MACRO_FACE_ADD_QUAD_FA(true, pVertices, vert_set, 0, 1, 5, 4);// top
	MACRO_FACE_ADD_QUAD_FA(true, pVertices, vert_set, 7, 6, 2, 3);// bottom
}